

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::MatchesConversions
          (ParsedFormatBase *this,bool allow_ignored,
          initializer_list<absl::lts_20250127::FormatConversionCharSet> convs)

{
  bool bVar1;
  char c;
  int iVar2;
  reference pCVar3;
  size_type sVar4;
  size_type sVar5;
  byte local_d2;
  UnboundConversion *conv;
  ConversionItem *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
  *__range2;
  anon_class_16_2_e79d1295 add_if_valid_conv;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> used;
  bool allow_ignored_local;
  ParsedFormatBase *this_local;
  initializer_list<absl::lts_20250127::FormatConversionCharSet> convs_local;
  
  convs_local._M_array = (iterator)convs._M_len;
  this_local = (ParsedFormatBase *)convs._M_array;
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &add_if_valid_conv.used);
  __range2 = (vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
              *)&this_local;
  add_if_valid_conv.convs =
       (initializer_list<absl::lts_20250127::FormatConversionCharSet> *)&add_if_valid_conv.used;
  __end2 = std::
           vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ::begin(&this->items_);
  item = (ConversionItem *)
         std::
         vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
         ::end(&this->items_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem_*,_std::vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>_>
                                *)&item);
    if (!bVar1) {
      sVar4 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
              size((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   &add_if_valid_conv.used);
      sVar5 = std::initializer_list<absl::lts_20250127::FormatConversionCharSet>::size
                        ((initializer_list<absl::lts_20250127::FormatConversionCharSet> *)
                         &this_local);
      local_d2 = 1;
      if (sVar4 != sVar5) {
        local_d2 = allow_ignored;
      }
      convs_local._M_len._7_1_ = local_d2 & 1;
LAB_0057ef93:
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )&add_if_valid_conv.used);
      return (bool)(convs_local._M_len._7_1_ & 1);
    }
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem_*,_std::vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>_>
             ::operator*(&__end2);
    if ((pCVar3->is_conversion & 1U) != 0) {
      bVar1 = UnboundConversion::InputValue::is_from_arg(&(pCVar3->conv).precision);
      if (bVar1) {
        iVar2 = UnboundConversion::InputValue::get_from_arg(&(pCVar3->conv).precision);
        bVar1 = MatchesConversions::anon_class_16_2_e79d1295::operator()
                          ((anon_class_16_2_e79d1295 *)&__range2,iVar2,'*');
        if (!bVar1) {
          convs_local._M_len._7_1_ = 0;
          goto LAB_0057ef93;
        }
      }
      bVar1 = UnboundConversion::InputValue::is_from_arg(&(pCVar3->conv).width);
      if (bVar1) {
        iVar2 = UnboundConversion::InputValue::get_from_arg(&(pCVar3->conv).width);
        bVar1 = MatchesConversions::anon_class_16_2_e79d1295::operator()
                          ((anon_class_16_2_e79d1295 *)&__range2,iVar2,'*');
        if (!bVar1) {
          convs_local._M_len._7_1_ = 0;
          goto LAB_0057ef93;
        }
      }
      iVar2 = (pCVar3->conv).arg_position;
      c = FormatConversionCharToChar((pCVar3->conv).conv);
      bVar1 = MatchesConversions::anon_class_16_2_e79d1295::operator()
                        ((anon_class_16_2_e79d1295 *)&__range2,iVar2,c);
      if (!bVar1) {
        convs_local._M_len._7_1_ = 0;
        goto LAB_0057ef93;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem_*,_std::vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ParsedFormatBase::MatchesConversions(
    bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs) const {
  std::unordered_set<int> used;
  auto add_if_valid_conv = [&](int pos, char c) {
    if (static_cast<size_t>(pos) > convs.size() ||
        !Contains(convs.begin()[pos - 1], c))
      return false;
    used.insert(pos);
    return true;
  };
  for (const ConversionItem &item : items_) {
    if (!item.is_conversion) continue;
    auto &conv = item.conv;
    if (conv.precision.is_from_arg() &&
        !add_if_valid_conv(conv.precision.get_from_arg(), '*'))
      return false;
    if (conv.width.is_from_arg() &&
        !add_if_valid_conv(conv.width.get_from_arg(), '*'))
      return false;
    if (!add_if_valid_conv(conv.arg_position,
                           FormatConversionCharToChar(conv.conv)))
      return false;
  }
  return used.size() == convs.size() || allow_ignored;
}